

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::MoveElementTo
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this,
          PageSegmentBase<Memory::VirtualAllocWrapper> *element,
          DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *list)

{
  code *pcVar1;
  bool bVar2;
  NodeBase *node_00;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> **ppDVar3;
  undefined8 *in_FS_OFFSET;
  Node *node;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *list_local;
  PageSegmentBase<Memory::VirtualAllocWrapper> *element_local;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_local;
  
  node_00 = (NodeBase *)(element[-1].decommitPages.data + 4);
  bVar2 = HasNode(this,node_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x1a9,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  RemoveNode(node_00);
  ppDVar3 = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                      (&list->
                        super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
  InsertNodeBefore(*ppDVar3,node_00);
  RealCount::DecrementCount(&this->super_RealCount);
  RealCount::IncrementCount(&list->super_RealCount);
  return;
}

Assistant:

void MoveElementTo(TData * element, DListBase * list)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        DListBase::InsertNodeBefore(list->Next(), node);
        this->DecrementCount();
        list->IncrementCount();
    }